

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_FSUB_R(Instruction *this,ostream *os)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  void *this_00;
  ostream *in_RSI;
  long in_RDI;
  int srcIndex;
  int dstIndex;
  
  bVar1 = *(byte *)(in_RDI + 1);
  bVar2 = *(byte *)(in_RDI + 2);
  poVar3 = std::operator<<(in_RSI,"f");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1 % 4);
  poVar3 = std::operator<<(poVar3,", a");
  this_00 = (void *)std::ostream::operator<<(poVar3,(uint)bVar2 % 4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Instruction::h_FSUB_R(std::ostream& os) const {
		auto dstIndex = dst % RegisterCountFlt;
		auto srcIndex = src % RegisterCountFlt;
		os << "f" << dstIndex << ", a" << srcIndex << std::endl;
	}